

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTPressureBMP180.cpp
# Opt level: O0

bool __thiscall RTPressureBMP180::pressureInit(RTPressureBMP180 *this)

{
  bool bVar1;
  byte local_38;
  byte local_37;
  byte local_36;
  byte local_35;
  byte local_34;
  byte local_32;
  byte local_31;
  uchar data [22];
  byte local_19;
  RTPressureBMP180 *pRStack_18;
  uchar result;
  RTPressureBMP180 *this_local;
  
  this->m_pressureAddr = ((this->super_RTPressure).m_settings)->m_I2CPressureAddress;
  pRStack_18 = this;
  bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                            this->m_pressureAddr,0xd0,'\x01',&local_19,"Failed to read BMP180 id");
  if (bVar1) {
    if (local_19 == 0x55) {
      bVar1 = RTIMUHal::HALRead(&((this->super_RTPressure).m_settings)->super_RTIMUHal,
                                this->m_pressureAddr,0xaa,'\x16',&local_38,
                                "Failed to read BMP180 calibration data");
      if (bVar1) {
        this->m_AC1 = (int)(short)((ushort)local_38 << 8) + (uint)local_37;
        this->m_AC2 = (int)(short)((ushort)local_36 << 8) + (uint)local_35;
        this->m_AC3 = (int)(short)((ushort)local_34 << 8) + (uint)local_34;
        this->m_AC4 = (uint)local_32 * 0x100 + (uint)local_31;
        this->m_AC5 = (uint)data[0] * 0x100 + (uint)data[1];
        this->m_AC6 = (uint)data[2] * 0x100 + (uint)data[3];
        this->m_B1 = (int)(short)((ushort)data[4] << 8) + (uint)data[5];
        this->m_B2 = (int)(short)((ushort)data[6] << 8) + (uint)data[7];
        this->m_MB = (int)(short)((ushort)data[8] << 8) + (uint)data[9];
        this->m_MC = (int)(short)((ushort)data[10] << 8) + (uint)data[0xb];
        this->m_MD = (int)(short)((ushort)data[0xc] << 8) + (uint)data[0xd];
        this->m_state = 0;
        this->m_oss = 0;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      fprintf(_stderr,"Incorrect BMP180 id %d\n",(ulong)local_19);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RTPressureBMP180::pressureInit()
{
    unsigned char result;
    unsigned char data[22];

    m_pressureAddr = m_settings->m_I2CPressureAddress;

    // check ID of chip

    if (!m_settings->HALRead(m_pressureAddr, BMP180_REG_ID, 1, &result, "Failed to read BMP180 id"))
        return false;

    if (result != BMP180_ID) {
        HAL_ERROR1("Incorrect BMP180 id %d\n", result);
        return false;
    }

    // get calibration data

    if (!m_settings->HALRead(m_pressureAddr, BMP180_REG_AC1, 22, data, "Failed to read BMP180 calibration data"))
        return false;

    m_AC1 = (int16_t)(((uint16_t)data[0]) << 8) + (uint16_t)data[1];
    m_AC2 = (int16_t)(((uint16_t)data[2]) << 8) + (uint16_t)data[3];
    m_AC3 = (int16_t)(((uint16_t)data[4]) << 8) + (uint16_t)data[4];
    m_AC4 = (((uint16_t)data[6]) << 8) + (uint16_t)data[7];
    m_AC5 = (((uint16_t)data[8]) << 8) + (uint16_t)data[9];
    m_AC6 = (((uint16_t)data[10]) << 8) + (uint16_t)data[11];
    m_B1 = (int16_t)(((uint16_t)data[12]) << 8) + (uint16_t)data[13];
    m_B2 = (int16_t)(((uint16_t)data[14]) << 8) + (uint16_t)data[15];
    m_MB = (int16_t)(((uint16_t)data[16]) << 8) + (uint16_t)data[17];
    m_MC = (int16_t)(((uint16_t)data[18]) << 8) + (uint16_t)data[19];
    m_MD = (int16_t)(((uint16_t)data[20]) << 8) + (uint16_t)data[21];

    m_state = BMP180_STATE_IDLE;
    m_oss = BMP180_SCO_PRESSURECONV_ULP;
    return true;
}